

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_fe.cc
# Opt level: O3

ElemMat * __thiscall
lf::uscalfe::LinearFELaplaceElementMatrix::Eval
          (ElemMat *__return_storage_ptr__,LinearFELaplaceElementMatrix *this,Entity *cell)

{
  scalar_constant_op<double> *psVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  source_loc loc_03;
  source_loc loc_04;
  element_type *peVar10;
  undefined8 uVar11;
  undefined8 rhs;
  int iVar12;
  long *plVar13;
  MatrixXd *pMVar14;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar15;
  Matrix<double,_4,_4,_0,_4,_4> *rhs_00;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar16;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar17;
  double *pdVar18;
  long lVar19;
  ulong uVar20;
  ActualDstType actualDst;
  long lVar21;
  ActualDstType actualDst_2;
  Matrix<double,_2,_1,_0,_2,_1> *pMVar22;
  SrcEvaluatorType srcEvaluator;
  Index outer;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  string_view_t fmt_02;
  string_view_t fmt_03;
  string_view_t fmt_04;
  RefEl ref_el;
  SrcEvaluatorType srcEvaluator_2;
  Matrix<double,_2,_4,_0,_2,_4> gradmat;
  Matrix<double,_2,_4,_0,_2,_4> G;
  double area;
  anon_class_8_1_54a397e7 DPhiadj;
  MatrixXd vertices;
  Matrix<double,_3,_3,_0,_3,_3> X;
  Vector2d qp;
  DstEvaluatorType dstEvaluator;
  stringstream ss;
  undefined8 uStack_420;
  undefined1 local_418 [16];
  Matrix<double,_2,_4,_0,_2,_4> local_408;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [64];
  undefined1 local_378 [8];
  variable_if_dynamic<long,__1> vStack_370;
  Matrix<double,__1,__1,_0,__1,__1> local_368;
  variable_if_dynamic<long,__1> vStack_350;
  double local_348;
  scalar_constant_op<double> sStack_340;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_> local_330;
  plainobjectbase_evaluator_data<double,_2> local_328;
  Index local_320;
  assign_op<double,_double> local_309;
  Scalar local_308;
  undefined1 local_300 [40];
  double local_2d8;
  double local_2d0;
  undefined1 local_2c8 [32];
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  Matrix<double,_2,_3,_0,_2,_3> local_278;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_2,_1,_3,_2>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_248;
  array<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_4UL> *local_228;
  Scalar local_220;
  undefined1 local_218 [16];
  scalar_constant_op<double> local_208;
  scalar_constant_op<double> sStack_200;
  undefined1 local_1f8 [48];
  double local_1c8;
  Matrix<double,_2,_3,_0,_2,_3> *pMStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_178;
  double local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  undefined1 *local_38;
  undefined4 extraout_var;
  
  iVar12 = (*cell->_vptr_Entity[4])(cell);
  uStack_420._7_1_ = (char)iVar12;
  iVar12 = (*cell->_vptr_Entity[3])(cell);
  plVar13 = (long *)CONCAT44(extraout_var,iVar12);
  if (plVar13 == (long *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Invalid geometry!",0x11);
    local_378 = (undefined1  [8])&local_368;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"geo_ptr != nullptr","");
    local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3c8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_378,(string *)local_3c8,0x2f,(string *)local_418);
    if ((Matrix<double,_2,_4,_0,_2,_4> *)local_418._0_8_ != &local_408) {
      operator_delete((void *)local_418._0_8_,
                      (ulong)((long)local_408.
                                    super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                                    m_storage.m_data.array[0] + 1));
    }
    if ((Matrix<double,_4,_4,_0,_4,_4> *)local_3c8._0_8_ !=
        (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8) {
      operator_delete((void *)local_3c8._0_8_,local_3b8._0_8_ + 1);
    }
    if (local_378 != (undefined1  [8])&local_368) {
      operator_delete((void *)local_378,
                      (long)local_368.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data + 1);
    }
    local_378 = (undefined1  [8])&local_368;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"false","");
    local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3c8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
               ,"");
    local_418._0_8_ = &local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"");
    base::AssertionFailed((string *)local_378,(string *)local_3c8,0x2f,(string *)local_418);
    goto LAB_003ac4c2;
  }
  iVar12 = (**(code **)(*plVar13 + 8))(plVar13);
  if (iVar12 == 2) {
    iVar12 = (**(code **)*plVar13)(plVar13);
    if (iVar12 == 2) {
      pMVar14 = base::RefEl::NodeCoords((RefEl *)((long)&uStack_420 + 7));
      (**(code **)(*plVar13 + 0x18))(local_300 + 0x20,plVar13,pMVar14);
      Logger();
      local_218._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
      ;
      local_218._8_4_ = 0x35;
      local_208.m_other = 2.28759953228879e-317;
      loc._8_8_ = local_218._8_8_;
      loc.filename = 
      "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
      ;
      loc.funcname = "Eval";
      fmt.size_ = 0xc;
      fmt.data_ = "{}, shape={}";
      spdlog::logger::log_<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                (Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,loc,trace,fmt,(RefEl *)((long)&uStack_420 + 7),
                 (Matrix<double,__1,__1,_0,__1,__1> *)(local_300 + 0x20));
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[0xe] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[0xf] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[0xc] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[0xd] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[10] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[0xb] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[8] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[9] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[6] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[7] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[4] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[5] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[2] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[3] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[0] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[1] = 0.0;
      if (uStack_420._7_1_ == '\x03') {
        if ((local_2d0 == 1.48219693752374e-323) && (local_2d8 == 9.88131291682493e-324)) {
          local_218._0_8_ = local_2c8 + 0x18;
          local_2c8._0_8_ = &DAT_3ff0000000000000;
          local_2c8._8_8_ = &DAT_3ff0000000000000;
          local_2c8._16_8_ = &DAT_3ff0000000000000;
          local_208.m_other = (double)local_2c8;
          sStack_200.m_other = 0.0;
          local_1f8._0_8_ = 4.94065645841247e-324;
          local_1f8._8_8_ = 1.48219693752374e-323;
          local_378 = (undefined1  [8])(local_300 + 0x20);
          Eigen::internal::
          checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_2,_false>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_true>
          ::run((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_2,_false> *)local_218,
                (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_378);
          pdVar18 = *(double **)local_378;
          lVar19 = *(Index *)((long)local_378 + 8);
          Eigen::internal::
          resize_if_allowed<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,2,false>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,double,double>
                    ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_2,_false> *)local_218,
                     (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_378,
                     (assign_op<double,_double> *)local_3c8);
          uVar11 = local_218._0_8_;
          (((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_218._0_8_)->m_storage).
          m_data.array[0] = *pdVar18;
          (((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)uVar11)->m_storage).m_data.
          array[1] = pdVar18[lVar19];
          (((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)uVar11)->m_storage).m_data.
          array[2] = pdVar18[lVar19 * 2];
          (((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)uVar11)->m_storage).m_data.
          array[3] = pdVar18[1];
          *(double *)(uVar11 + 0x20) = pdVar18[lVar19 + 1];
          ((double *)(uVar11 + 0x20))[1] = pdVar18[lVar19 * 2 + 1];
          local_308 = ABS(((double)local_2c8._0_8_ *
                           (local_288 * local_2a8 - dStack_2a0 * dStack_290) -
                          ((double)local_2c8._8_8_ * local_288 +
                          -dStack_290 * (double)local_2c8._16_8_) * (double)local_2c8._24_8_) +
                          local_298 *
                          ((double)local_2c8._8_8_ * dStack_2a0 -
                          (double)local_2c8._16_8_ * local_2a8)) * 0.5;
          Logger();
          peVar10 = Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
          local_3c8._8_8_ = 0.0;
          local_3b8._0_8_ = 0.0;
          local_3c8._0_8_ = Eigen::internal::aligned_malloc(0x10);
          pMVar22 = &this->kTriabc;
          local_3c8._8_8_ = 9.88131291682493e-324;
          local_3b8._0_8_ = 4.94065645841247e-324;
          Eigen::internal::
          resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,2,1,0,2,1>,double,double>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_3c8,pMVar22,
                     (assign_op<double,_double> *)local_378);
          lVar19 = local_3b8._0_8_ * local_3c8._8_8_;
          uVar20 = lVar19 - (lVar19 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < lVar19) {
            lVar21 = 0;
            do {
              pdVar18 = (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                        m_storage.m_data.array + lVar21;
              dVar23 = pdVar18[1];
              *(double *)(local_3c8._0_8_ + lVar21 * 8) = *pdVar18;
              ((double *)(local_3c8._0_8_ + lVar21 * 8))[1] = dVar23;
              lVar21 = lVar21 + 2;
            } while (lVar21 < (long)uVar20);
          }
          if ((long)uVar20 < lVar19) {
            do {
              *(double *)(local_3c8._0_8_ + uVar20 * 8) =
                   (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage
                   .m_data.array[uVar20];
              uVar20 = uVar20 + 1;
            } while (lVar19 - uVar20 != 0);
          }
          (**(code **)(*plVar13 + 0x30))(local_418,plVar13,local_3c8);
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[0] = (double)&DAT_3fe0000000000000;
          Eigen::
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
          ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            *)local_378,local_418._8_8_,1,(scalar_constant_op<double> *)&local_278);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           *)local_218,(Lhs *)local_378,(Rhs *)local_418,
                          (scalar_product_op<double,_double> *)&local_248);
          local_378 = (undefined1  [8])0x48a6a2;
          vStack_370.m_value._0_4_ = 0x4b;
          local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)0x46a689;
          loc_02._8_8_ = vStack_370.m_value;
          loc_02.filename =
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
          ;
          loc_02.funcname = "Eval";
          fmt_02.size_ = 0xf;
          fmt_02.data_ = "Area: {} <-> {}";
          spdlog::logger::
          log_<double_const&,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>
                    (peVar10,loc_02,trace,fmt_02,&local_308,
                     (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_218);
          free((void *)local_418._0_8_);
          free((void *)local_3c8._0_8_);
          local_378 = (undefined1  [8])local_2c8;
          vStack_370.m_value = 1;
          local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)0x0;
          local_218._0_8_ = local_218 + 8;
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<double,_3,_3,_0,_3,_3> *)local_218._0_8_,(SrcXprType *)local_378,
                (assign_op<double,_double> *)local_3c8);
          local_1c8 = (double)vStack_370.m_value;
          pdVar18 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218._0_8_)->
                    m_storage).m_data.array +
                    vStack_370.m_value +
                    (long)local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_data * 3;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[0] = *pdVar18;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[1] = pdVar18[1];
          pdVar18 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218._0_8_)->
                    m_storage).m_data.array +
                    vStack_370.m_value +
                    (long)local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_data * 3 + 3;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[2] = *pdVar18;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[3] = pdVar18[1];
          pdVar18 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218._0_8_)->
                    m_storage).m_data.array +
                    vStack_370.m_value +
                    (long)local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_data * 3 + 6;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[4] = *pdVar18;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[5] = pdVar18[1];
          local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)local_308;
          sStack_340.m_other = local_308;
          local_320 = 2;
          local_248.m_dst = (DstEvaluatorType *)local_300;
          local_248.m_functor = (assign_op<double,_double> *)&local_220;
          sStack_200.m_other = local_308;
          local_1f8._16_8_ = 0.0;
          local_1f8._24_8_ = 0.0;
          local_1b8 = 0.0;
          dStack_1b0 = 0.0;
          local_1a8 = 9.88131291682493e-324;
          local_3b8._0_8_ = local_308;
          local_3b8._24_8_ = 0.0;
          local_3b8._32_8_ = 0.0;
          local_3b8._40_8_ = 0.0;
          local_3b8._16_8_ = &local_278;
          local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = (Index)&local_278;
          vStack_350.m_value = (long)&local_278;
          local_330.m_d.data =
               (plainobjectbase_evaluator_data<double,_2>)
               (plainobjectbase_evaluator_data<double,_2>)&local_278;
          local_328.data = (double *)&local_278;
          local_300._0_8_ = (DstXprType *)local_418;
          local_248.m_src = (SrcEvaluatorType *)local_378;
          local_248.m_dstExpr = (DstXprType *)local_418;
          local_1f8._0_8_ = &local_278;
          local_1f8._40_8_ = &local_278;
          pMStack_1c0 = &local_278;
          Eigen::internal::
          block_evaluator<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>::
          block_evaluator((block_evaluator<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>
                           *)(local_3b8 + 0x30),(XprType *)(local_1f8 + 0x28));
          psVar1 = (scalar_constant_op<double> *)(local_3b8._32_8_ * 8 + local_3b8._16_8_) +
                   local_3b8._24_8_ * 2;
          local_418._0_8_ =
               *(double *)(local_3b8._48_8_ + 8) * psVar1[1].m_other * (double)local_3b8._0_8_ +
               *(double *)local_3b8._48_8_ * psVar1->m_other * (double)local_3b8._0_8_;
          Eigen::internal::
          copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_2,_1,_3,_2>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_9>
          ::run(&local_248);
          pdVar18 = (__return_storage_ptr__->
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                    array + 2;
          lVar19 = 0x10;
          do {
            dVar23 = *(double *)((long)&uStack_420 + lVar19);
            ((plain_array<double,_16,_0,_16> *)(pdVar18 + -2))->array[0] =
                 *(double *)(&stack0xfffffffffffffbd8 + lVar19);
            pdVar18[-1] = dVar23;
            *pdVar18 = *(double *)(local_418 + lVar19);
            lVar19 = lVar19 + 0x18;
            pdVar18 = pdVar18 + 4;
          } while (lVar19 != 0x58);
LAB_003ac053:
          Logger();
          peVar10 = Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
                    ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_218,
                     __return_storage_ptr__,0,0,(Index)local_2d0,(Index)local_2d0);
          local_378 = (undefined1  [8])0x48a6a2;
          vStack_370.m_value._0_4_ = 0x9c;
          local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)0x46a689;
          loc_03._8_8_ = vStack_370.m_value;
          loc_03.filename =
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
          ;
          loc_03.funcname = "Eval";
          fmt_03.size_ = 0x11;
          fmt_03.data_ = "Element matrix\n{}";
          spdlog::logger::log_<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
                    (peVar10,loc_03,trace,fmt_03,
                     (Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_218);
          Logger();
          peVar10 = Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
                    ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_3c8,
                     __return_storage_ptr__,0,0,(Index)local_2d0,(Index)local_2d0);
          local_1f8._16_8_ = local_3b8._32_8_;
          local_1f8._0_8_ = local_3b8._16_8_;
          local_1f8._8_8_ = local_3b8._24_8_;
          local_208.m_other = (double)local_3b8._0_8_;
          sStack_200.m_other = (double)local_3b8._8_8_;
          local_218._0_8_ = local_3c8._0_8_;
          local_218._8_8_ = local_3c8._8_8_;
          Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
                    ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_418,
                     __return_storage_ptr__,0,0,(Index)local_2d0,(Index)local_2d0);
          local_348 = local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                      m_storage.m_data.array[4];
          local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = (Index)local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                          m_storage.m_data.array[2];
          vStack_350.m_value =
               (long)local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                     m_storage.m_data.array[3];
          local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)
                   local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.
                   m_data.array[0];
          local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = (Index)local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                          m_storage.m_data.array[1];
          local_378 = (undefined1  [8])local_418._0_8_;
          vStack_370.m_value = local_418._8_8_;
          local_2c8._0_8_ =
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
          ;
          local_2c8._8_4_ = 0x9f;
          local_2c8._16_8_ = "Eval";
          loc_04._8_8_ = local_2c8._8_8_;
          loc_04.filename =
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
          ;
          loc_04.funcname = "Eval";
          fmt_04.size_ = 0x1c;
          fmt_04.data_ = "Row sums = {},\ncol sums = {}";
          spdlog::logger::
          log_<Eigen::PartialReduxExpr<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::internal::member_sum<double,double>,0>const,Eigen::Transpose<Eigen::PartialReduxExpr<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::internal::member_sum<double,double>,1>const>const>
                    (peVar10,loc_04,trace,fmt_04,
                     (PartialReduxExpr<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::internal::member_sum<double,_double>,_0>
                      *)local_218,
                     (Transpose<const_Eigen::PartialReduxExpr<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::internal::member_sum<double,_double>,_1>_>
                      *)local_378);
          free((void *)local_300._32_8_);
          return __return_storage_ptr__;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_218);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Wrong size of vertex matrix!",0x1c);
        local_378 = (undefined1  [8])&local_368;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_378,"(vertices.cols() == 3) && (vertices.rows() == 2)","");
        local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_378,(string *)local_3c8,0x42,(string *)local_418);
        if ((Matrix<double,_2,_4,_0,_2,_4> *)local_418._0_8_ != &local_408) {
          operator_delete((void *)local_418._0_8_,
                          (ulong)((long)local_408.
                                        super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>
                                        .m_storage.m_data.array[0] + 1));
        }
        if ((Matrix<double,_4,_4,_0,_4,_4> *)local_3c8._0_8_ !=
            (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8) {
          operator_delete((void *)local_3c8._0_8_,local_3b8._0_8_ + 1);
        }
        if (local_378 != (undefined1  [8])&local_368) {
          operator_delete((void *)local_378,
                          (long)local_368.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_data + 1);
        }
        local_378 = (undefined1  [8])&local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"false","");
        local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                   ,"");
        local_418._0_8_ = &local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"");
        base::AssertionFailed((string *)local_378,(string *)local_3c8,0x42,(string *)local_418);
      }
      else if (uStack_420._7_1_ == '\x04') {
        if ((local_2d0 == 1.97626258336499e-323) && (local_2d8 == 9.88131291682493e-324)) {
          local_3c8._0_8_ = local_218;
          local_3c8._8_8_ = 0.0;
          local_3b8._0_8_ = 4.94065645841247e-324;
          local_3b8._8_8_ = (XprTypeNested)0x1;
          local_218._0_8_ = &DAT_3ff0000000000000;
          local_2c8._0_8_ = &DAT_bff0000000000000;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_3c8,
                               (Scalar *)local_2c8);
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[0] = (double)&DAT_bff0000000000000;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,(Scalar *)&local_278);
          local_248.m_dst = (DstEvaluatorType *)&DAT_3ff0000000000000;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,(Scalar *)&local_248);
          local_300._0_8_ = (Matrix<double,_2,_4,_0,_2,_4> *)0x0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,(Scalar *)local_300);
          local_308 = 1.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_308);
          local_220 = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_220);
          local_38 = &DAT_bff0000000000000;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,(Scalar *)&local_38);
          local_40 = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_40);
          local_48 = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_48);
          local_50 = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_50);
          local_58 = 1.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_58);
          local_60 = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_60);
          local_68 = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_68);
          local_70 = 1.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_70);
          local_78 = &DAT_bff0000000000000;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,(Scalar *)&local_78);
          rhs_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::finished(pCVar15)
          ;
          Eigen::
          Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
          ::Product((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
                     *)local_418,(Lhs *)(local_300 + 0x20),rhs_00);
          rhs = local_418._8_8_;
          uVar11 = local_418._0_8_;
          if (*(double *)(local_418._0_8_ + 8) != 9.88131291682493e-324) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_378,
                       (Index)*(double *)(local_418._0_8_ + 8),4);
          }
          Eigen::
          Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>
          ::Product((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>
                     *)local_418,(Lhs *)uVar11,(Rhs *)rhs);
          uVar11 = local_418._8_8_;
          pdVar18 = *(double **)local_418._0_8_;
          dVar23 = *(double *)(local_418._0_8_ + 8);
          Eigen::internal::
          resize_if_allowed<Eigen::Matrix<double,2,4,0,2,4>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,4,4,0,4,4>,1>,double,double>
                    ((Matrix<double,_2,_4,_0,_2,_4> *)local_378,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>
                      *)local_418,&local_309);
          local_378 = (undefined1  [8])
                      (*(double *)(uVar11 + 0x18) * pdVar18[(long)dVar23 * 3] +
                      *(double *)(uVar11 + 0x10) * pdVar18[(long)dVar23 * 2] +
                      *(double *)(uVar11 + 8) * pdVar18[(long)dVar23] + *(double *)uVar11 * *pdVar18
                      );
          vStack_370.m_value =
               (long)(*(double *)(uVar11 + 0x18) * (pdVar18 + (long)dVar23 * 3)[1] +
                     *(double *)(uVar11 + 0x10) * (pdVar18 + (long)dVar23 * 2)[1] +
                     *(double *)(uVar11 + 8) * (pdVar18 + (long)dVar23)[1] +
                     *(double *)uVar11 * pdVar18[1]);
          local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)
                   (*(double *)(uVar11 + 0x38) * pdVar18[(long)dVar23 * 3] +
                   *(double *)(uVar11 + 0x30) * pdVar18[(long)dVar23 * 2] +
                   *(double *)(uVar11 + 0x28) * pdVar18[(long)dVar23] +
                   *(double *)(uVar11 + 0x20) * *pdVar18);
          local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = (Index)(*(double *)(uVar11 + 0x38) * (pdVar18 + (long)dVar23 * 3)[1] +
                          *(double *)(uVar11 + 0x30) * (pdVar18 + (long)dVar23 * 2)[1] +
                          *(double *)(uVar11 + 0x28) * (pdVar18 + (long)dVar23)[1] +
                          *(double *)(uVar11 + 0x20) * pdVar18[1]);
          local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = (Index)(*(double *)(uVar11 + 0x58) * pdVar18[(long)dVar23 * 3] +
                          *(double *)(uVar11 + 0x50) * pdVar18[(long)dVar23 * 2] +
                          *(double *)(uVar11 + 0x48) * pdVar18[(long)dVar23] +
                          *(double *)(uVar11 + 0x40) * *pdVar18);
          vStack_350.m_value =
               (long)(*(double *)(uVar11 + 0x58) * (pdVar18 + (long)dVar23 * 3)[1] +
                     *(double *)(uVar11 + 0x50) * (pdVar18 + (long)dVar23 * 2)[1] +
                     *(double *)(uVar11 + 0x48) * (pdVar18 + (long)dVar23)[1] +
                     *(double *)(uVar11 + 0x40) * pdVar18[1]);
          local_348 = *(double *)(uVar11 + 0x78) * pdVar18[(long)dVar23 * 3] +
                      *(double *)(uVar11 + 0x70) * pdVar18[(long)dVar23 * 2] +
                      *(double *)(uVar11 + 0x68) * pdVar18[(long)dVar23] +
                      *(double *)(uVar11 + 0x60) * *pdVar18;
          sStack_340.m_other =
               *(double *)(uVar11 + 0x78) * (pdVar18 + (long)dVar23 * 3)[1] +
               *(double *)(uVar11 + 0x70) * (pdVar18 + (long)dVar23 * 2)[1] +
               *(double *)(uVar11 + 0x68) * (pdVar18 + (long)dVar23)[1] +
               *(double *)(uVar11 + 0x60) * pdVar18[1];
          Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::finished
                    ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_3c8);
          local_3c8._0_8_ =
               (double)vStack_350.m_value *
               (double)local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data -
               (double)local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols *
               (double)local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows;
          local_218._8_8_ = 0.0;
          local_208.m_other = 4.94065645841247e-324;
          sStack_200.m_other = 4.94065645841247e-324;
          local_418._0_8_ =
               (double)local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data * sStack_340.m_other -
               (double)local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows * local_348;
          local_218._0_8_ = (CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_3c8;
          pCVar16 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_218,
                               (Scalar *)local_418);
          local_2c8._0_8_ =
               (double)vStack_350.m_value * local_348 -
               sStack_340.m_other *
               (double)local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols;
          pCVar16 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                              (pCVar16,(Scalar *)local_2c8);
          pMVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
                              (pCVar16);
          local_300._24_8_ =
               (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0];
          local_300._16_8_ =
               (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[1];
          local_300._8_8_ =
               (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
          Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
                    ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_218);
          Logger();
          peVar10 = Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          local_2c8._0_8_ =
               ABS((this->kQuadpt).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                   m_storage.m_data.array[1] * (double)local_300._8_8_ +
                   (this->kQuadpt).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                   m_storage.m_data.array[0] * (double)local_300._16_8_ + (double)local_300._24_8_);
          local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
          local_3c8._8_8_ = 0.0;
          local_3b8._0_8_ = 0.0;
          local_3c8._0_8_ = Eigen::internal::aligned_malloc(0x10);
          pMVar22 = &this->kQuadpt;
          local_3c8._8_8_ = 9.88131291682493e-324;
          local_3b8._0_8_ = 4.94065645841247e-324;
          Eigen::internal::
          resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,2,1,0,2,1>,double,double>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_3c8,pMVar22,
                     (assign_op<double,_double> *)local_218);
          lVar19 = local_3b8._0_8_ * local_3c8._8_8_;
          uVar20 = lVar19 - (lVar19 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < lVar19) {
            lVar21 = 0;
            do {
              pdVar18 = (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                        m_storage.m_data.array + lVar21;
              dVar23 = pdVar18[1];
              *(double *)(local_3c8._0_8_ + lVar21 * 8) = *pdVar18;
              ((double *)(local_3c8._0_8_ + lVar21 * 8))[1] = dVar23;
              lVar21 = lVar21 + 2;
            } while (lVar21 < (long)uVar20);
          }
          if ((long)uVar20 < lVar19) {
            do {
              *(double *)(local_3c8._0_8_ + uVar20 * 8) =
                   (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage
                   .m_data.array[uVar20];
              uVar20 = uVar20 + 1;
            } while (lVar19 - uVar20 != 0);
          }
          (**(code **)(*plVar13 + 0x30))(local_418,plVar13,local_3c8);
          local_218._0_8_ =
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
          ;
          local_218._8_4_ = 0x72;
          local_208.m_other = 2.28759953228879e-317;
          loc_00._8_8_ = local_218._8_8_;
          loc_00.filename =
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
          ;
          loc_00.funcname = "Eval";
          fmt_00.size_ = 0x16;
          fmt_00.data_ = "Determinant: {} <-> {}";
          spdlog::logger::log_<double,Eigen::Matrix<double,_1,1,0,_1,1>>
                    (peVar10,loc_00,debug,fmt_00,(double *)local_2c8,
                     (Matrix<double,__1,_1,_0,__1,_1> *)local_418);
          free((void *)local_418._0_8_);
          free((void *)local_3c8._0_8_);
          local_300._0_8_ = local_378;
          Logger();
          peVar10 = Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          Eval::anon_class_8_1_54a397e7::operator()
                    ((Matrix<double,_2,_2,_0,_2,_2> *)local_3c8,(anon_class_8_1_54a397e7 *)local_300
                     ,pMVar22);
          local_208.m_other =
               ABS((this->kQuadpt).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                   m_storage.m_data.array[1] * (double)local_300._8_8_ +
                   (this->kQuadpt).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                   m_storage.m_data.array[0] * (double)local_300._16_8_ + (double)local_300._24_8_);
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[0] = 0.0;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[1] = 0.0;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[2] = 0.0;
          local_218._0_8_ = (Matrix<double,_3,_3,_0,_3,_3> *)local_3c8;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[0] = (double)Eigen::internal::aligned_malloc(0x10);
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[1] = 9.88131291682493e-324;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[2] = 4.94065645841247e-324;
          Eigen::internal::
          resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,2,1,0,2,1>,double,double>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)&local_278,pMVar22,
                     (assign_op<double,_double> *)local_418);
          lVar19 = (long)local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                         m_storage.m_data.array[2] *
                   (long)local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                         m_storage.m_data.array[1];
          uVar20 = lVar19 - (lVar19 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < lVar19) {
            lVar21 = 0;
            do {
              pdVar2 = (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                       m_storage.m_data.array + lVar21;
              dVar23 = pdVar2[1];
              pdVar18 = (double *)
                        ((long)local_278.
                               super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                               m_storage.m_data.array[0] + lVar21 * 8);
              *pdVar18 = *pdVar2;
              pdVar18[1] = dVar23;
              lVar21 = lVar21 + 2;
            } while (lVar21 < (long)uVar20);
          }
          if ((long)uVar20 < lVar19) {
            do {
              *(double *)
               ((long)local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                      m_storage.m_data.array[0] + uVar20 * 8) =
                   (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage
                   .m_data.array[uVar20];
              uVar20 = uVar20 + 1;
            } while (lVar19 - uVar20 != 0);
          }
          (**(code **)(*plVar13 + 0x28))(local_2c8,plVar13,&local_278);
          local_418._0_8_ =
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
          ;
          local_418._8_4_ = 0x81;
          local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.
          array[0] = 2.28759953228879e-317;
          loc_01._8_8_ = local_418._8_8_;
          loc_01.filename =
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
          ;
          loc_01.funcname = "Eval";
          fmt_01.size_ = 0x24;
          fmt_01.data_ = "InverseTransposedJacobian:\n{} <-> {}";
          spdlog::logger::
          log_<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,2,2,0,2,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,2,0,2,2>const>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    (peVar10,loc_01,trace,fmt_01,
                     (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                      *)local_218,(Matrix<double,__1,__1,_0,__1,__1> *)local_2c8);
          free((void *)local_2c8._0_8_);
          free((void *)local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                       m_storage.m_data.array[0]);
          local_228 = &this->kQuadPoints;
          lVar19 = 0;
          do {
            local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
            array[0] = local_228->_M_elems[lVar19].
                       super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
                       .array[0];
            local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
            array[1] = local_228->_M_elems[lVar19].
                       super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
                       .array[1];
            Eval::anon_class_8_1_54a397e7::operator()
                      ((Matrix<double,_2,_2,_0,_2,_2> *)local_418,
                       (anon_class_8_1_54a397e7 *)local_300,(Vector2d *)&local_278);
            DervRefShapFncts((Matrix<double,_4,_2,_0,_4,_2> *)local_218,(Vector2d *)&local_278);
            local_3c8._0_8_ =
                 (double)local_1f8._0_8_ *
                 local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.
                 m_data.array[0] + (double)local_218._0_8_ * (double)local_418._0_8_;
            local_3c8._8_8_ =
                 (double)local_1f8._0_8_ *
                 local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.
                 m_data.array[1] + (double)local_218._0_8_ * (double)local_418._8_8_;
            local_3b8._0_8_ =
                 (double)local_1f8._8_8_ *
                 local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.
                 m_data.array[0] + (double)local_218._8_8_ * (double)local_418._0_8_;
            local_3b8._8_8_ =
                 (double)local_1f8._8_8_ *
                 local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.
                 m_data.array[1] + (double)local_218._8_8_ * (double)local_418._8_8_;
            local_3b8._16_8_ =
                 (double)local_1f8._16_8_ *
                 local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.
                 m_data.array[0] + local_208.m_other * (double)local_418._0_8_;
            local_3b8._24_8_ =
                 (double)local_1f8._16_8_ *
                 local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.
                 m_data.array[1] + local_208.m_other * (double)local_418._8_8_;
            local_3b8._32_8_ =
                 (double)local_1f8._24_8_ *
                 local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.
                 m_data.array[0] + sStack_200.m_other * (double)local_418._0_8_;
            local_3b8._40_8_ =
                 (double)local_1f8._24_8_ *
                 local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.
                 m_data.array[1] + sStack_200.m_other * (double)local_418._8_8_;
            local_88 = ABS(local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                           m_storage.m_data.array[1] * (double)local_300._8_8_ +
                           local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                           m_storage.m_data.array[0] * (double)local_300._16_8_ +
                           (double)local_300._24_8_);
            uStack_80 = 0;
            local_418._0_8_ = local_3c8;
            local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.
            array[2] = 9.88131291682493e-324;
            local_2c8._0_8_ = &local_248;
            local_2c8._8_8_ = local_418;
            local_2c8._16_8_ = &local_308;
            lVar21 = 0;
            local_418._8_8_ = local_418._0_8_;
            local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.
            array[0] = (double)local_418._0_8_;
            local_408.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.
            array[1] = (double)local_418._0_8_;
            local_2c8._24_8_ = (DstXprType *)local_1f8;
            local_248.m_dst = (DstEvaluatorType *)local_1f8;
            local_208.m_other = (double)local_1f8;
            do {
              Eigen::internal::
              copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>,_Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_4>
              ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>,_Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)local_2c8,lVar21);
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
            local_178 = local_88;
            auVar24._8_8_ = local_88;
            auVar24._0_8_ = local_88;
            auVar24 = divpd(*(undefined1 (*) [16])local_208.m_other,auVar24);
            dVar23 = auVar24._0_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[0];
            dVar25 = auVar24._8_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[1];
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[0] = dVar23;
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[1] = dVar25;
            auVar3._8_8_ = local_88;
            auVar3._0_8_ = local_88;
            auVar24 = divpd(*(undefined1 (*) [16])((long)local_208.m_other + 0x10),auVar3);
            dVar26 = auVar24._0_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[2];
            dVar27 = auVar24._8_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[3];
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[2] = dVar26;
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[3] = dVar27;
            auVar4._8_8_ = local_88;
            auVar4._0_8_ = local_88;
            auVar24 = divpd(*(undefined1 (*) [16])((long)local_208.m_other + 0x20),auVar4);
            dVar28 = auVar24._0_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[4];
            dVar29 = auVar24._8_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[5];
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[4] = dVar28;
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[5] = dVar29;
            auVar5._8_8_ = local_88;
            auVar5._0_8_ = local_88;
            auVar24 = divpd(*(undefined1 (*) [16])((long)local_208.m_other + 0x30),auVar5);
            dVar30 = auVar24._0_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[6];
            dVar31 = auVar24._8_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[7];
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[6] = dVar30;
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[7] = dVar31;
            auVar6._8_8_ = local_88;
            auVar6._0_8_ = local_88;
            auVar24 = divpd(*(undefined1 (*) [16])((long)local_208.m_other + 0x40),auVar6);
            dVar32 = auVar24._0_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[8];
            dVar33 = auVar24._8_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[9];
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[8] = dVar32;
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[9] = dVar33;
            auVar7._8_8_ = local_88;
            auVar7._0_8_ = local_88;
            auVar24 = divpd(*(undefined1 (*) [16])((long)local_208.m_other + 0x50),auVar7);
            dVar34 = auVar24._0_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[10];
            dVar35 = auVar24._8_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[0xb];
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[10] = dVar34;
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[0xb] = dVar35;
            auVar8._8_8_ = local_88;
            auVar8._0_8_ = local_88;
            auVar24 = divpd(*(undefined1 (*) [16])((long)local_208.m_other + 0x60),auVar8);
            dVar36 = auVar24._0_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[0xc];
            dVar37 = auVar24._8_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[0xd];
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[0xc] = dVar36;
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[0xd] = dVar37;
            auVar9._8_8_ = local_88;
            auVar9._0_8_ = local_88;
            auVar24 = divpd(*(undefined1 (*) [16])((long)local_208.m_other + 0x70),auVar9);
            dVar38 = auVar24._0_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[0xe];
            dVar39 = auVar24._8_8_ +
                     (__return_storage_ptr__->
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array[0xf];
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[0xe] = dVar38;
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[0xf] = dVar39;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 4);
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0] = dVar23 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[1] = dVar25 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[2] = dVar26 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[3] = dVar27 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[4] = dVar28 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[5] = dVar29 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[6] = dVar30 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[7] = dVar31 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[8] = dVar32 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[9] = dVar33 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[10] = dVar34 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0xb] = dVar35 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0xc] = dVar36 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0xd] = dVar37 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0xe] = dVar38 * 0.25;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0xf] = dVar39 * 0.25;
          goto LAB_003ac053;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_218);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Wrong size of vertex matrix!",0x1c);
        local_378 = (undefined1  [8])&local_368;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_378,"(vertices.cols() == 4) && (vertices.rows() == 2)","");
        local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_378,(string *)local_3c8,0x58,(string *)local_418);
        if ((Matrix<double,_2,_4,_0,_2,_4> *)local_418._0_8_ != &local_408) {
          operator_delete((void *)local_418._0_8_,
                          (ulong)((long)local_408.
                                        super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>
                                        .m_storage.m_data.array[0] + 1));
        }
        if ((Matrix<double,_4,_4,_0,_4,_4> *)local_3c8._0_8_ !=
            (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8) {
          operator_delete((void *)local_3c8._0_8_,local_3b8._0_8_ + 1);
        }
        if (local_378 != (undefined1  [8])&local_368) {
          operator_delete((void *)local_378,
                          (long)local_368.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_data + 1);
        }
        local_378 = (undefined1  [8])&local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"false","");
        local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                   ,"");
        local_418._0_8_ = &local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"");
        base::AssertionFailed((string *)local_378,(string *)local_3c8,0x58,(string *)local_418);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)local_218);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Illegal cell type",0x11);
        local_378 = (undefined1  [8])&local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"false","");
        local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_378,(string *)local_3c8,0x96,(string *)local_418);
        if ((Matrix<double,_2,_4,_0,_2,_4> *)local_418._0_8_ != &local_408) {
          operator_delete((void *)local_418._0_8_,
                          (ulong)((long)local_408.
                                        super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>
                                        .m_storage.m_data.array[0] + 1));
        }
        if ((Matrix<double,_4,_4,_0,_4,_4> *)local_3c8._0_8_ !=
            (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8) {
          operator_delete((void *)local_3c8._0_8_,local_3b8._0_8_ + 1);
        }
        if (local_378 != (undefined1  [8])&local_368) {
          operator_delete((void *)local_378,
                          (long)local_368.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_data + 1);
        }
        local_378 = (undefined1  [8])&local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"false","");
        local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                   ,"");
        local_418._0_8_ = &local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"");
        base::AssertionFailed((string *)local_378,(string *)local_3c8,0x96,(string *)local_418);
      }
      goto LAB_003ac4c2;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_218);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_208,"Only 2D implementation available!",0x21);
  local_378 = (undefined1  [8])&local_368;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_378,"(geo_ptr->DimGlobal() == 2) && (geo_ptr->DimLocal() == 2)","");
  local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed((string *)local_378,(string *)local_3c8,0x31,(string *)local_418);
  if ((Matrix<double,_2,_4,_0,_2,_4> *)local_418._0_8_ != &local_408) {
    operator_delete((void *)local_418._0_8_,
                    (ulong)((long)local_408.
                                  super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                                  m_storage.m_data.array[0] + 1));
  }
  if ((Matrix<double,_4,_4,_0,_4,_4> *)local_3c8._0_8_ != (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8
     ) {
    operator_delete((void *)local_3c8._0_8_,local_3b8._0_8_ + 1);
  }
  if (local_378 != (undefined1  [8])&local_368) {
    operator_delete((void *)local_378,
                    (long)local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_data + 1);
  }
  local_378 = (undefined1  [8])&local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"false","");
  local_3c8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_3b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
             ,"");
  local_418._0_8_ = &local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"");
  base::AssertionFailed((string *)local_378,(string *)local_3c8,0x31,(string *)local_418);
LAB_003ac4c2:
  std::__cxx11::string::~string((string *)local_418);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)local_378);
  abort();
}

Assistant:

LinearFELaplaceElementMatrix::ElemMat LinearFELaplaceElementMatrix::Eval(
    const lf::mesh::Entity &cell) const {
  // Topological type of the cell
  const lf::base::RefEl ref_el{cell.RefEl()};

  // Obtain the vertex coordinates of the cell, which completely
  // describe its shape.
  const lf::geometry::Geometry *geo_ptr = cell.Geometry();
  LF_ASSERT_MSG(geo_ptr != nullptr, "Invalid geometry!");
  LF_ASSERT_MSG((geo_ptr->DimGlobal() == 2) && (geo_ptr->DimLocal() == 2),
                "Only 2D implementation available!");
  // Matrix storing corner coordinates in its columns
  auto vertices = geo_ptr->Global(ref_el.NodeCoords());
  // Debugging output
  SPDLOG_LOGGER_TRACE(Logger(), "{}, shape={}", ref_el, vertices);

  // 4x4 dense matrix for returning result
  ElemMat elem_mat = ElemMat::Zero(4, 4);

  // Computations differ depending on the type of the cell
  switch (ref_el) {
    case lf::base::RefEl::kTria(): {
      // Triangular cell: straight edges assumed, which means that the triangle
      // is an affine image of the unit triangle and that the gradients of the
      // local shape functions (= barycentric coordinate functions) are
      // constant.
      LF_ASSERT_MSG((vertices.cols() == 3) && (vertices.rows() == 2),
                    "Wrong size of vertex matrix!");
      // Set up an auxiliary 3x3-matrix with a leading column 1 and
      // the vertex coordinates in its right 3x2 block
      Eigen::Matrix<double, 3, 3> X;  // temporary matrix
      X.block<3, 1>(0, 0) = Eigen::Vector3d::Ones();
      X.block<3, 2>(0, 1) = vertices.transpose();
      // The determinant of the auxliriary matrix also supplies the area
      const double area = 0.5 * std::abs(X.determinant());
      SPDLOG_LOGGER_TRACE(Logger(), "Area: {} <-> {}", area,
                          0.5 * geo_ptr->IntegrationElement(kTriabc));

      // Compute the gradients of the barycentric coordinate functions
      // and store them in the columns of a 2x3 matrix grad_bary_coords
      Eigen::Matrix<double, 2, 3> grad_bary_coords{
          X.inverse().block<2, 3>(1, 0)};
      // Since the gradients are constant local integration is easy
      elem_mat.block<3, 3>(0, 0) =
          area * grad_bary_coords.transpose() * grad_bary_coords;
      break;
    }
    case lf::base::RefEl::kQuad(): {
      LF_ASSERT_MSG((vertices.cols() == 4) && (vertices.rows() == 2),
                    "Wrong size of vertex matrix!");
      // Coefficient matrix for bilinear mapping to actual cell
      // clang-format off
      Eigen::Matrix<double, 2, 4> G(vertices *
                                    (Eigen::Matrix<double, 4, 4>() <<
				     1, -1, -1, 1,
				     0, 1 , 0, -1,
				     0, 0, 0, 1,
				     0, 0, 1, -1)
                                        .finished());
      // clang-format on 
      // Coefficients for the determinant as a linear function in
      // the reference coordinates
      // clang-format off
      Eigen::Vector3d detc{
          (Eigen::Vector3d() <<
	   G(0, 1) * G(1, 2) - G(1, 1) * G(0, 2),
           G(0, 1) * G(1, 3) - G(1, 1) * G(0, 3),
           G(1, 2) * G(0, 3) - G(0, 2) * G(1, 3))
              .finished()};
      // clang-format on
      // Determinant at a point in the reference element
      auto detDPhi = [&detc](const Eigen::Vector2d &xh) -> double {
        return std::abs(detc[0] + detc[1] * xh[0] + detc[2] * xh[1]);
      };
      SPDLOG_LOGGER_DEBUG(Logger(), "Determinant: {} <-> {}", detDPhi(kQuadpt),
                          geo_ptr->IntegrationElement(kQuadpt));

      // Transposed adjunct matrix of Jacobian of transformation
      auto DPhiadj =
          [&G](const Eigen::Vector2d &xh) -> Eigen::Matrix<double, 2, 2> {
        // clang-format off
        return ((Eigen::Matrix<double, 2, 2>() <<
		 G(1, 2) + G(1, 3) * xh[0] , -G(1, 1) - G(1, 3) * xh[1],
		 -G(0, 2) - G(0, 3) * xh[0], G(0, 1) + G(0, 3) * xh[1])
                    .finished());
        // clang-format on
      };
      // Output for debugging
      SPDLOG_LOGGER_TRACE(Logger(), "InverseTransposedJacobian:\n{} <-> {}",
                          (DPhiadj(kQuadpt) / detDPhi(kQuadpt)),
                          (geo_ptr->JacobianInverseGramian(kQuadpt)));

      // For a quadrilateral we have to use numerical quadrature based on
      // a 2-2 tensor-product Gauss rule.
      // Sum over quadrature points (weight= 0.5)
      for (int q = 0; q < 4; ++q) {
        // Obtain reference coordinates of current quadrature point
        const Eigen::Vector2d qp(kQuadPoints[q]);
        // Gradients of shape functions in quadrature points stored in
        // the columns of a matrix
        Eigen::Matrix<double, 2, 4> gradmat(DPhiadj(qp) *
                                            DervRefShapFncts(qp).transpose());
        // Update of element matrix by contribution from current quadrature
        // point, whose entries are dot products of gradients
        elem_mat += gradmat.transpose() * gradmat / detDPhi(qp);
      }
      // Scaling with quadrature weights
      elem_mat *= 0.25;
      break;
    }
    default: {
      LF_ASSERT_MSG(false, "Illegal cell type");
    }
  }  // end switch

  auto nv = vertices.cols();
  SPDLOG_LOGGER_TRACE(Logger(), "Element matrix\n{}",
                      elem_mat.block(0, 0, nv, nv));
  SPDLOG_LOGGER_TRACE(Logger(), "Row sums = {},\ncol sums = {}",
                      elem_mat.block(0, 0, nv, nv).colwise().sum(),
                      elem_mat.block(0, 0, nv, nv).rowwise().sum().transpose());

  // Return the element matrix
  return elem_mat;
}